

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O2

void __thiscall
DifferentialEquation::DifferentialEquation
          (DifferentialEquation *this,Time *time,double x0,double dx0,string *name,string *type)

{
  allocator<char> local_59;
  string local_58;
  double local_30;
  double local_28;
  
  local_30 = x0;
  local_28 = dx0;
  StochasticVariable::StochasticVariable(&this->super_StochasticVariable,time,name,type);
  (this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__DifferentialEquation_00154928;
  (this->super_StochasticVariable).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__DifferentialEquation_001549b8;
  (this->super_StochasticVariable).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__DifferentialEquation_00154a00;
  (this->eqnIntegrands).
  super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eqnIntegrands).
  super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eqnIntegrands).
  super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->eqnIntegrators).
  super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eqnIntegrators).
  super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eqnIntegrators).
  super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->eqnX0 = local_30;
  this->eqnTermAmount = 0;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  std::vector<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::_M_move_assign
            (&this->eqnIntegrands,&local_58);
  std::_Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::~_Vector_base
            ((_Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_> *)&local_58)
  ;
  this->eqnTermAmount = 0;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  std::vector<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::_M_move_assign
            (&this->eqnIntegrators,&local_58);
  std::_Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::~_Vector_base
            ((_Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_> *)&local_58)
  ;
  this->eqnMethodPtr = (offset_in_DifferentialEquation_to_subr)stepEulerIto;
  *(undefined8 *)&this->field_0x158 = 0;
  (this->super_StochasticVariable).super_StochasticProcess.stochNextValue = local_30;
  (this->super_StochasticVariable).super_StochasticProcess.stochCurrentValue = local_30;
  this->eqnIncrement = local_28;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"equation",&local_59);
  Parametric::addParameter((Parametric *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"mode",&local_59);
  Parametric::addParameter((Parametric *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"starting-value",&local_59)
  ;
  Parametric::addParameter((Parametric *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

DifferentialEquation::DifferentialEquation(Time *time, double x0, double dx0, const string& name, const string& type)
	: StochasticVariable(time, name, type)
{
	eqnX0 = x0;
	eqnTermAmount = 0;
	eqnIntegrands = vector<StochasticFunction *>();
	eqnTermAmount = 0;
	eqnIntegrators = vector<StochasticVariable *>();
	eqnMethodPtr = &DifferentialEquation::stepEulerIto;
	stochCurrentValue = stochNextValue = x0;
	eqnIncrement = dx0;
	addParameter("equation");
	addParameter("mode");
	addParameter("starting-value");
}